

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O1

vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
* vkt::sr::anon_unknown_0::generateCubeCaseIterations
            (vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
             *__return_storage_ptr__,GatherType gatherType,TextureFormat *textureFormat,
            IVec2 *offsetRange)

{
  int *piVar1;
  pointer pGVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  pointer pGVar8;
  uint uVar9;
  pointer pGVar10;
  uint uVar11;
  ulong uVar12;
  CubeFace CVar13;
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  basicIterations;
  value_type local_88;
  ulong local_58;
  TextureFormat *local_50;
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  local_48;
  
  local_50 = textureFormat;
  generateBasic2DCaseIterations(&local_48,gatherType,textureFormat,offsetRange);
  pGVar8 = local_48.
           super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = (int)((long)local_48.
                      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_48.
                      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x38e38e39;
  local_58 = (ulong)(uVar9 & 0x7fffffff);
  CVar13 = CUBEFACE_NEGATIVE_X;
  do {
    if (CVar13 == CUBEFACE_NEGATIVE_X) {
      uVar12 = local_58;
      pGVar10 = pGVar8;
      if (0 < (int)uVar9) {
        do {
          local_88.face = CUBEFACE_NEGATIVE_X;
          local_88.gatherArgs.componentNdx = -1;
          local_88.gatherArgs.offsets[2].m_data[0] = 0;
          local_88.gatherArgs.offsets[2].m_data[1] = 0;
          local_88.gatherArgs.offsets[3].m_data[0] = 0;
          local_88.gatherArgs.offsets[3].m_data[1] = 0;
          local_88.gatherArgs.offsets[0].m_data[0] = 0;
          local_88.gatherArgs.offsets[0].m_data[1] = 0;
          local_88.gatherArgs.offsets[1].m_data[0] = 0;
          local_88.gatherArgs.offsets[1].m_data[1] = 0;
          std::
          vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
          ::push_back(__return_storage_ptr__,&local_88);
          pGVar2 = (__return_storage_ptr__->
                   super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          pGVar2[-1].gatherArgs.offsets[3].m_data[1] = pGVar10->offsets[3].m_data[1];
          iVar3 = pGVar10->componentNdx;
          iVar4 = pGVar10->offsets[0].m_data[0];
          iVar5 = pGVar10->offsets[0].m_data[1];
          iVar6 = pGVar10->offsets[1].m_data[0];
          uVar7 = *(undefined8 *)(pGVar10->offsets[2].m_data + 1);
          *(undefined8 *)(pGVar2[-1].gatherArgs.offsets[1].m_data + 1) =
               *(undefined8 *)(pGVar10->offsets[1].m_data + 1);
          *(undefined8 *)(pGVar2[-1].gatherArgs.offsets[2].m_data + 1) = uVar7;
          pGVar2[-1].gatherArgs.componentNdx = iVar3;
          pGVar2[-1].gatherArgs.offsets[0].m_data[0] = iVar4;
          pGVar2[-1].gatherArgs.offsets[0].m_data[1] = iVar5;
          pGVar2[-1].gatherArgs.offsets[1].m_data[0] = iVar6;
          pGVar2[-1].face = CUBEFACE_NEGATIVE_X;
          uVar12 = uVar12 - 1;
          pGVar10 = pGVar10 + 1;
        } while (uVar12 != 0);
      }
    }
    else if (0 < (int)uVar9) {
      uVar12 = 0;
      pGVar10 = pGVar8;
      do {
        if ((local_50->order == D) || (local_50->order == DS)) {
          uVar12 = 0;
LAB_00668ac9:
          local_88.face = CUBEFACE_NEGATIVE_X;
          local_88.gatherArgs.componentNdx = -1;
          local_88.gatherArgs.offsets[2].m_data[0] = 0;
          local_88.gatherArgs.offsets[2].m_data[1] = 0;
          local_88.gatherArgs.offsets[3].m_data[0] = 0;
          local_88.gatherArgs.offsets[3].m_data[1] = 0;
          local_88.gatherArgs.offsets[0].m_data[0] = 0;
          local_88.gatherArgs.offsets[0].m_data[1] = 0;
          local_88.gatherArgs.offsets[1].m_data[0] = 0;
          local_88.gatherArgs.offsets[1].m_data[1] = 0;
          std::
          vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
          ::push_back(__return_storage_ptr__,&local_88);
          pGVar2 = (__return_storage_ptr__->
                   super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          pGVar2[-1].gatherArgs.offsets[3].m_data[1] = pGVar8[uVar12].offsets[3].m_data[1];
          pGVar10 = pGVar8 + uVar12;
          iVar3 = pGVar10->componentNdx;
          iVar4 = pGVar10->offsets[0].m_data[0];
          iVar5 = pGVar10->offsets[0].m_data[1];
          iVar6 = pGVar10->offsets[1].m_data[0];
          piVar1 = pGVar8[uVar12].offsets[1].m_data + 1;
          uVar7 = *(undefined8 *)(piVar1 + 2);
          *(undefined8 *)(pGVar2[-1].gatherArgs.offsets[1].m_data + 1) = *(undefined8 *)piVar1;
          *(undefined8 *)(pGVar2[-1].gatherArgs.offsets[2].m_data + 1) = uVar7;
          pGVar2[-1].gatherArgs.componentNdx = iVar3;
          pGVar2[-1].gatherArgs.offsets[0].m_data[0] = iVar4;
          pGVar2[-1].gatherArgs.offsets[0].m_data[1] = iVar5;
          pGVar2[-1].gatherArgs.offsets[1].m_data[0] = iVar6;
          pGVar2[-1].face = CVar13;
          break;
        }
        if (pGVar10->componentNdx == (CVar13 & CUBEFACE_POSITIVE_Y)) goto LAB_00668ac9;
        uVar11 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar11;
        pGVar10 = pGVar10 + 1;
      } while (uVar9 != uVar11);
    }
    CVar13 = CVar13 + CUBEFACE_POSITIVE_X;
    if (CVar13 == CUBEFACE_LAST) {
      if (local_48.
          super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

vector<GatherCubeArgs> generateCubeCaseIterations (GatherType gatherType, const tcu::TextureFormat& textureFormat, const IVec2& offsetRange)
{
	const vector<GatherArgs>	basicIterations = generateBasic2DCaseIterations(gatherType, textureFormat, offsetRange);
	vector<GatherCubeArgs>		iterations;

	for (int cubeFaceI = 0; cubeFaceI < tcu::CUBEFACE_LAST; cubeFaceI++)
	{
		const tcu::CubeFace cubeFace = (tcu::CubeFace)cubeFaceI;

		// Don't duplicate all cases for all faces.
		if (cubeFaceI == 0)
		{
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				iterations.push_back(GatherCubeArgs());
				iterations.back().gatherArgs = basicIterations[basicNdx];
				iterations.back().face = cubeFace;
			}
		}
		else
		{
			// For other faces than first, only test one component per face.
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				if (isDepthFormat(textureFormat) || basicIterations[basicNdx].componentNdx == cubeFaceI % 4)
				{
					iterations.push_back(GatherCubeArgs());
					iterations.back().gatherArgs = basicIterations[basicNdx];
					iterations.back().face = cubeFace;
					break;
				}
			}
		}
	}

	return iterations;
}